

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O3

context_t __thiscall cs::create_context(cs *this,array *args)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  instance_type *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  method_base *pmVar7;
  domain_manager *pdVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  undefined8 **ppuVar10;
  undefined1 *size;
  _Any_data *p_Var11;
  any *paVar12;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *p_Var13;
  translator_type *this_00;
  context_t cVar14;
  undefined1 local_eb8 [16];
  _Elt_pointer local_ea8;
  _Elt_pointer pptStack_ea0;
  _Elt_pointer local_e98;
  _Map_pointer ppptStack_e90;
  _Elt_pointer local_e88;
  _Elt_pointer pptStack_e80;
  _Elt_pointer local_e78;
  _Map_pointer ppptStack_e70;
  namespace_t local_e60;
  namespace_t local_e50;
  namespace_t local_e40;
  namespace_t local_e30;
  namespace_t local_e20;
  namespace_t local_e10;
  namespace_t local_e00;
  namespace_t local_df0;
  cs *local_de0;
  any local_dd8;
  undefined8 *local_dd0;
  undefined8 *local_dc8;
  undefined8 *local_dc0;
  undefined8 *local_db8;
  any local_db0;
  undefined8 *local_da8;
  undefined8 *local_da0;
  undefined8 *local_d98;
  undefined8 *local_d90;
  any local_d88;
  undefined8 *local_d80;
  undefined8 *local_d78;
  undefined8 *local_d70;
  undefined8 *local_d68;
  any local_d60;
  undefined8 *local_d58;
  undefined8 *local_d50;
  undefined8 *local_d48;
  undefined8 *local_d40;
  undefined8 *local_d38;
  undefined8 *local_d30;
  _Any_data local_d28;
  code *local_d18;
  code *pcStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 *local_cd0;
  undefined8 *local_cc8;
  undefined8 *local_cc0;
  undefined8 *local_cb8;
  undefined8 *local_cb0;
  undefined8 *local_ca8;
  undefined8 *local_ca0;
  undefined8 *local_c98;
  undefined8 *local_c90;
  undefined8 *local_c88;
  undefined8 *local_c80;
  undefined8 *local_c78;
  undefined8 *local_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 *local_c58;
  undefined8 *local_c50;
  undefined8 *local_c48;
  undefined8 *local_c40;
  undefined8 *local_c38;
  undefined8 *local_c30;
  undefined8 *local_c28;
  undefined8 *local_c20;
  undefined8 *local_c18;
  undefined8 *local_c10;
  undefined8 *local_c08;
  undefined8 *local_c00;
  undefined8 *local_bf8;
  undefined8 *local_bf0;
  undefined8 *local_be8;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  undefined8 *local_bc8;
  undefined8 *local_bc0;
  undefined8 *local_bb8;
  undefined8 *local_bb0;
  undefined8 *local_ba8;
  undefined8 *local_ba0;
  undefined8 *local_b98;
  undefined8 *local_b90;
  undefined8 *local_b88;
  undefined8 *local_b80;
  undefined8 *local_b78;
  undefined8 *local_b70;
  undefined8 *local_b68;
  undefined8 *local_b60;
  undefined8 *local_b58;
  undefined8 *local_b50;
  undefined8 *local_b48;
  undefined8 *local_b40;
  undefined8 *local_b38;
  undefined8 *local_b30;
  undefined8 *local_b28;
  undefined8 *local_b20;
  undefined8 *local_b18;
  undefined8 *local_b10;
  undefined8 *local_b08;
  undefined8 *local_b00;
  undefined8 *local_af8;
  undefined8 *local_af0;
  undefined8 *local_ae8;
  undefined8 *local_ae0;
  undefined8 *local_ad8;
  undefined8 *local_ad0;
  undefined8 *local_ac8;
  undefined8 *local_ac0;
  undefined8 *local_ab8;
  undefined8 *local_ab0;
  undefined8 *local_aa8;
  undefined8 *local_aa0;
  undefined8 *local_a98;
  undefined8 *local_a90;
  undefined8 *local_a88;
  undefined8 *local_a80;
  undefined8 *local_a78;
  undefined8 *local_a70;
  undefined8 *local_a68;
  undefined8 *local_a60;
  _Any_data local_a58;
  code *local_a48;
  code *pcStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  _Any_data local_a08;
  code *local_9f8;
  code *pcStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  _Any_data local_9b8;
  code *local_9a8;
  code *pcStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  _Any_data local_968;
  code *local_958;
  code *pcStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  _Any_data local_918;
  code *local_908;
  code *pcStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  _Any_data local_8c8;
  code *local_8b8;
  code *pcStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 *local_878;
  undefined8 *local_870;
  undefined8 *local_868;
  undefined8 *local_860;
  _Any_data local_858;
  code *local_848;
  code *pcStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  _Any_data local_808;
  code *local_7f8;
  code *pcStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  _Any_data local_7b8;
  code *local_7a8;
  code *pcStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  _Any_data local_768;
  code *local_758;
  code *pcStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_718;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_6c8;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_678;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_628;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_5d8;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_588;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_538;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_4e8;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_498;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_448;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_3f8;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_3a8;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_358;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_308;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_2b8;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_268;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_218;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_1c8;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_178;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_128;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_d8;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_88;
  
  size = local_eb8;
  cs_impl::init_extensions((cs_impl *)this);
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cs::context_type,std::allocator<cs::context_type>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(context_type **)this,
             (allocator<cs::context_type> *)local_eb8);
  local_eb8._0_8_ = (instance_type *)0x0;
  local_de0 = this + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cs::compiler_type,std::allocator<cs::compiler_type>,std::shared_ptr<cs::context_type>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_eb8 + 8),
             (compiler_type **)local_eb8,(allocator<cs::compiler_type> *)&local_d28,
             (shared_ptr<cs::context_type> *)this);
  uVar5 = local_eb8._8_8_;
  uVar4 = local_eb8._0_8_;
  puVar6 = *(undefined8 **)this;
  local_eb8._0_8_ = (instance_type *)0x0;
  local_eb8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[1];
  *puVar6 = uVar4;
  puVar6[1] = uVar5;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_eb8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_eb8._8_8_);
  }
  local_eb8._0_8_ = (instance_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cs::instance_type,std::allocator<cs::instance_type>,std::shared_ptr<cs::context_type>&,unsigned_long&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_eb8 + 8),
             (instance_type **)local_eb8,(allocator<cs::instance_type> *)&local_d28,
             (shared_ptr<cs::context_type> *)this,(unsigned_long *)(current_process + 0x78));
  uVar5 = local_eb8._8_8_;
  uVar4 = local_eb8._0_8_;
  lVar2 = *(long *)this;
  local_eb8._0_8_ = (instance_type *)0x0;
  local_eb8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 0x18);
  *(undefined8 *)(lVar2 + 0x10) = uVar4;
  *(undefined8 *)(lVar2 + 0x18) = uVar5;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_eb8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_eb8._8_8_);
    }
  }
  cs_impl::any::
  make_constant<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&>
            ((any *)local_eb8,args);
  puVar6 = (undefined8 *)(*(long *)this + 0xb0);
  if ((undefined8 *)local_eb8 != puVar6) {
    piVar3 = (instance_type *)*puVar6;
    *puVar6 = local_eb8._0_8_;
    local_eb8._0_8_ = piVar3;
  }
  cs_impl::any::recycle((any *)local_eb8);
  lVar2 = **(long **)this;
  local_c40 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)args);
  local_c40[1] = 1;
  *local_c40 = &PTR__token_expr_00334520;
  local_c40[2] = 0;
  local_c38 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)args);
  local_c38[1] = 0;
  *local_c38 = &PTR__token_base_00332bc0;
  local_eb8._0_8_ = (instance_type *)0x0;
  local_eb8._8_8_ = 0;
  local_ea8 = (_Elt_pointer)0x0;
  pptStack_ea0 = (_Elt_pointer)0x0;
  local_e98 = (_Elt_pointer)0x0;
  ppptStack_e90 = (_Map_pointer)0x0;
  local_e88 = (_Elt_pointer)0x0;
  pptStack_e80 = (_Elt_pointer)0x0;
  local_e78 = (_Elt_pointer)0x0;
  ppptStack_e70 = (_Map_pointer)0x0;
  ppuVar10 = &local_c40;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_003336c8;
  this_00 = (translator_type *)(lVar2 + 0x30);
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_eb8,pmVar7)
  ;
  local_a70 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)size);
  local_a70[1] = 1;
  *local_a70 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_a70 + 2) = 0;
  local_a68 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)size);
  local_a68[1] = 1;
  *local_a68 = &PTR__token_expr_00334520;
  local_a68[2] = 0;
  local_a60 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)size);
  local_a60[1] = 0;
  *local_a60 = &PTR__token_base_00332bc0;
  local_d28._M_unused._M_object = (void *)0x0;
  local_d28._8_8_ = 0;
  local_d18 = (code *)0x0;
  pcStack_d10 = (code *)0x0;
  local_d08 = 0;
  uStack_d00 = 0;
  local_cf8 = 0;
  uStack_cf0 = 0;
  local_ce8 = 0;
  uStack_ce0 = 0;
  ppuVar10 = &local_a70;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x58,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_import_00333728;
  pmVar7[1]._vptr_method_base = (_func_int **)0x0;
  pmVar7[2]._vptr_method_base = (_func_int **)0x0;
  pmVar7[3]._vptr_method_base = (_func_int **)0x0;
  pmVar7[4]._vptr_method_base = (_func_int **)0x0;
  pmVar7[5]._vptr_method_base = (_func_int **)0x0;
  pmVar7[6]._vptr_method_base = (_func_int **)0x0;
  pmVar7[7]._vptr_method_base = (_func_int **)0x0;
  pmVar7[8]._vptr_method_base = (_func_int **)0x0;
  pmVar7[9]._vptr_method_base = (_func_int **)0x0;
  pmVar7[10]._vptr_method_base = (_func_int **)0x0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            ((_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             (pmVar7 + 1),0);
  p_Var11 = &local_d28;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var11,pmVar7);
  local_d88.mDat = (proxy *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  (local_d88.mDat)->refcount = 1;
  *(undefined ***)local_d88.mDat = &PTR__token_base_00332fd8;
  *(undefined4 *)&(local_d88.mDat)->data = 0;
  local_d80 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_d80[1] = 1;
  *local_d80 = &PTR__token_expr_00334520;
  local_d80[2] = 0;
  local_d78 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_d78[1] = 1;
  *local_d78 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_d78 + 2) = 1;
  local_d70 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_d70[1] = 1;
  *local_d70 = &PTR__token_expr_00334520;
  local_d70[2] = 0;
  local_d68 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var11);
  local_d68[1] = 0;
  *local_d68 = &PTR__token_base_00332bc0;
  local_768._M_unused._M_object = (void *)0x0;
  local_768._8_8_ = 0;
  local_758 = (code *)0x0;
  pcStack_750 = (code *)0x0;
  local_748 = 0;
  uStack_740 = 0;
  local_738 = 0;
  uStack_730 = 0;
  local_728 = 0;
  uStack_720 = 0;
  paVar12 = &local_d88;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x58,(size_t)paVar12);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_import_as_00333788;
  pmVar7[1]._vptr_method_base = (_func_int **)0x0;
  pmVar7[2]._vptr_method_base = (_func_int **)0x0;
  pmVar7[3]._vptr_method_base = (_func_int **)0x0;
  pmVar7[4]._vptr_method_base = (_func_int **)0x0;
  pmVar7[5]._vptr_method_base = (_func_int **)0x0;
  pmVar7[6]._vptr_method_base = (_func_int **)0x0;
  pmVar7[7]._vptr_method_base = (_func_int **)0x0;
  pmVar7[8]._vptr_method_base = (_func_int **)0x0;
  pmVar7[9]._vptr_method_base = (_func_int **)0x0;
  pmVar7[10]._vptr_method_base = (_func_int **)0x0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            ((_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             (pmVar7 + 1),0);
  p_Var11 = &local_768;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var11,pmVar7);
  local_a88 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_a88[1] = 1;
  *local_a88 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_a88 + 2) = 2;
  local_a80 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_a80[1] = 1;
  *local_a80 = &PTR__token_expr_00334520;
  local_a80[2] = 0;
  local_a78 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var11);
  local_a78[1] = 0;
  *local_a78 = &PTR__token_base_00332bc0;
  local_7b8._M_unused._M_object = (void *)0x0;
  local_7b8._8_8_ = 0;
  local_7a8 = (code *)0x0;
  pcStack_7a0 = (code *)0x0;
  local_798 = 0;
  uStack_790 = 0;
  local_788 = 0;
  uStack_780 = 0;
  local_778 = 0;
  uStack_770 = 0;
  ppuVar10 = &local_a88;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_003337e8;
  p_Var11 = &local_7b8;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var11,pmVar7);
  local_aa0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_aa0[1] = 1;
  *local_aa0 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_aa0 + 2) = 3;
  local_a98 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_a98[1] = 1;
  *local_a98 = &PTR__token_expr_00334520;
  local_a98[2] = 0;
  local_a90 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var11);
  local_a90[1] = 0;
  *local_a90 = &PTR__token_base_00332bc0;
  local_808._M_unused._M_object = (void *)0x0;
  local_808._8_8_ = 0;
  local_7f8 = (code *)0x0;
  pcStack_7f0 = (code *)0x0;
  local_7e8 = 0;
  uStack_7e0 = 0;
  local_7d8 = 0;
  uStack_7d0 = 0;
  local_7c8 = 0;
  uStack_7c0 = 0;
  ppuVar10 = &local_aa0;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x58,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_involve_00333848;
  pmVar7[1]._vptr_method_base = (_func_int **)0x0;
  pmVar7[2]._vptr_method_base = (_func_int **)0x0;
  pmVar7[3]._vptr_method_base = (_func_int **)0x0;
  pmVar7[4]._vptr_method_base = (_func_int **)0x0;
  pmVar7[5]._vptr_method_base = (_func_int **)0x0;
  pmVar7[6]._vptr_method_base = (_func_int **)0x0;
  pmVar7[7]._vptr_method_base = (_func_int **)0x0;
  pmVar7[8]._vptr_method_base = (_func_int **)0x0;
  pmVar7[9]._vptr_method_base = (_func_int **)0x0;
  pmVar7[10]._vptr_method_base = (_func_int **)0x0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            ((_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             (pmVar7 + 1),0);
  p_Var11 = &local_808;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var11,pmVar7);
  local_ab8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_ab8[1] = 1;
  *local_ab8 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_ab8 + 2) = 9;
  local_ab0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_ab0[1] = 1;
  *local_ab0 = &PTR__token_expr_00334520;
  local_ab0[2] = 0;
  local_aa8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var11);
  local_aa8[1] = 0;
  *local_aa8 = &PTR__token_base_00332bc0;
  local_858._M_unused._M_object = (void *)0x0;
  local_858._8_8_ = 0;
  local_848 = (code *)0x0;
  pcStack_840 = (code *)0x0;
  local_838 = 0;
  uStack_830 = 0;
  local_828 = 0;
  uStack_820 = 0;
  local_818 = 0;
  uStack_810 = 0;
  ppuVar10 = &local_ab8;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_003338a8;
  p_Var11 = &local_858;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var11,pmVar7);
  local_ad0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_ad0[1] = 1;
  *local_ad0 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_ad0 + 2) = 10;
  local_ac8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_ac8[1] = 1;
  *local_ac8 = &PTR__token_expr_00334520;
  local_ac8[2] = 0;
  local_ac0 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var11);
  local_ac0[1] = 0;
  *local_ac0 = &PTR__token_base_00332bc0;
  local_8c8._M_unused._M_object = (void *)0x0;
  local_8c8._8_8_ = 0;
  local_8b8 = (code *)0x0;
  pcStack_8b0 = (code *)0x0;
  local_8a8 = 0;
  uStack_8a0 = 0;
  local_898 = 0;
  uStack_890 = 0;
  local_888 = 0;
  uStack_880 = 0;
  ppuVar10 = &local_ad0;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333908;
  p_Var11 = &local_8c8;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var11,pmVar7);
  local_ae8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_ae8[1] = 1;
  *local_ae8 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_ae8 + 2) = 0xb;
  local_ae0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_ae0[1] = 1;
  *local_ae0 = &PTR__token_expr_00334520;
  local_ae0[2] = 0;
  local_ad8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var11);
  local_ad8[1] = 0;
  *local_ad8 = &PTR__token_base_00332bc0;
  local_918._M_unused._M_object = (void *)0x0;
  local_918._8_8_ = 0;
  local_908 = (code *)0x0;
  pcStack_900 = (code *)0x0;
  local_8f8 = 0;
  uStack_8f0 = 0;
  local_8e8 = 0;
  uStack_8e0 = 0;
  local_8d8 = 0;
  uStack_8d0 = 0;
  ppuVar10 = &local_ae8;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333968;
  p_Var11 = &local_918;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var11,pmVar7);
  local_c50 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_c50[1] = 1;
  *local_c50 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_c50 + 2) = 8;
  local_c48 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var11);
  local_c48[1] = 0;
  *local_c48 = &PTR__token_base_00332bc0;
  local_968._M_unused._M_object = (void *)0x0;
  local_968._8_8_ = 0;
  local_958 = (code *)0x0;
  pcStack_950 = (code *)0x0;
  local_948 = 0;
  uStack_940 = 0;
  local_938 = 0;
  uStack_930 = 0;
  local_928 = 0;
  uStack_920 = 0;
  ppuVar10 = &local_c50;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333028;
  p_Var11 = &local_968;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var11,pmVar7);
  local_c60 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_c60[1] = 1;
  *local_c60 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_c60 + 2) = 7;
  local_c58 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var11);
  local_c58[1] = 0;
  *local_c58 = &PTR__token_base_00332bc0;
  local_9b8._M_unused._M_object = (void *)0x0;
  local_9b8._8_8_ = 0;
  local_9a8 = (code *)0x0;
  pcStack_9a0 = (code *)0x0;
  local_998 = 0;
  uStack_990 = 0;
  local_988 = 0;
  uStack_980 = 0;
  local_978 = 0;
  uStack_970 = 0;
  ppuVar10 = &local_c60;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_003339c8;
  p_Var11 = &local_9b8;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var11,pmVar7);
  local_b00 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_b00[1] = 1;
  *local_b00 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_b00 + 2) = 4;
  local_af8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_af8[1] = 1;
  *local_af8 = &PTR__token_expr_00334520;
  local_af8[2] = 0;
  local_af0 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var11);
  local_af0[1] = 0;
  *local_af0 = &PTR__token_base_00332bc0;
  local_a08._M_unused._M_object = (void *)0x0;
  local_a08._8_8_ = 0;
  local_9f8 = (code *)0x0;
  pcStack_9f0 = (code *)0x0;
  local_9e8 = 0;
  uStack_9e0 = 0;
  local_9d8 = 0;
  uStack_9d0 = 0;
  local_9c8 = 0;
  uStack_9c0 = 0;
  ppuVar10 = &local_b00;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333a28;
  p_Var11 = &local_a08;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var11,pmVar7);
  local_b18 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_b18[1] = 1;
  *local_b18 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_b18 + 2) = 0xd;
  local_b10 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_b10[1] = 1;
  *local_b10 = &PTR__token_expr_00334520;
  local_b10[2] = 0;
  local_b08 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var11);
  local_b08[1] = 0;
  *local_b08 = &PTR__token_base_00332bc0;
  local_a58._M_unused._M_object = (void *)0x0;
  local_a58._8_8_ = 0;
  local_a48 = (code *)0x0;
  pcStack_a40 = (code *)0x0;
  local_a38 = 0;
  uStack_a30 = 0;
  local_a28 = 0;
  uStack_a20 = 0;
  local_a18 = 0;
  uStack_a10 = 0;
  ppuVar10 = &local_b18;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333a88;
  p_Var11 = &local_a58;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var11,pmVar7);
  local_c70 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var11);
  local_c70[1] = 1;
  *local_c70 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_c70 + 2) = 0xe;
  local_c68 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var11);
  local_c68[1] = 0;
  *local_c68 = &PTR__token_base_00332bc0;
  local_1c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_c70;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333ae8;
  p_Var13 = &local_1c8;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_b30 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_b30[1] = 1;
  *local_b30 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_b30 + 2) = 0xf;
  local_b28 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_b28[1] = 1;
  *local_b28 = &PTR__token_expr_00334520;
  local_b28[2] = 0;
  local_b20 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_b20[1] = 0;
  *local_b20 = &PTR__token_base_00332bc0;
  local_218._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_b30;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333b48;
  p_Var13 = &local_218;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_b48 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_b48[1] = 1;
  *local_b48 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_b48 + 2) = 0x10;
  local_b40 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_b40[1] = 1;
  *local_b40 = &PTR__token_expr_00334520;
  local_b40[2] = 0;
  local_b38 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_b38[1] = 0;
  *local_b38 = &PTR__token_base_00332bc0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_b48;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333ba8;
  p_Var13 = &local_88;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_c80 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_c80[1] = 1;
  *local_c80 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_c80 + 2) = 0x11;
  local_c78 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_c78[1] = 0;
  *local_c78 = &PTR__token_base_00332bc0;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_c80;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333c08;
  p_Var13 = &local_d8;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_b60 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_b60[1] = 1;
  *local_b60 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_b60 + 2) = 0x12;
  local_b58 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_b58[1] = 1;
  *local_b58 = &PTR__token_expr_00334520;
  local_b58[2] = 0;
  local_b50 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_b50[1] = 0;
  *local_b50 = &PTR__token_base_00332bc0;
  local_128._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_b60;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333c68;
  p_Var13 = &local_128;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_b78 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_b78[1] = 1;
  *local_b78 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_b78 + 2) = 0x14;
  local_b70 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_b70[1] = 1;
  *local_b70 = &PTR__token_expr_00334520;
  local_b70[2] = 0;
  local_b68 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_b68[1] = 0;
  *local_b68 = &PTR__token_base_00332bc0;
  local_178._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_b78;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333cc8;
  p_Var13 = &local_178;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_c90 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_c90[1] = 1;
  *local_c90 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_c90 + 2) = 0x13;
  local_c88 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_c88[1] = 0;
  *local_c88 = &PTR__token_base_00332bc0;
  local_268._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_c90;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333d30;
  p_Var13 = &local_268;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_b90 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_b90[1] = 1;
  *local_b90 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_b90 + 2) = 0x15;
  local_b88 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_b88[1] = 1;
  *local_b88 = &PTR__token_expr_00334520;
  local_b88[2] = 0;
  local_b80 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_b80[1] = 0;
  *local_b80 = &PTR__token_base_00332bc0;
  local_2b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_b90;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333d90;
  p_Var13 = &local_2b8;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_db0.mDat = (proxy *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  (local_db0.mDat)->refcount = 1;
  *(undefined ***)local_db0.mDat = &PTR__token_base_00332fd8;
  *(undefined4 *)&(local_db0.mDat)->data = 0x15;
  local_da8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_da8[1] = 1;
  *local_da8 = &PTR__token_expr_00334520;
  local_da8[2] = 0;
  local_da0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_da0[1] = 1;
  *local_da0 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_da0 + 2) = 0xc;
  local_d98 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_d98[1] = 1;
  *local_d98 = &PTR__token_expr_00334520;
  local_d98[2] = 0;
  local_d90 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_d90[1] = 0;
  *local_d90 = &PTR__token_base_00332bc0;
  local_308._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_308._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_308._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  paVar12 = &local_db0;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)paVar12);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333df0;
  p_Var13 = &local_308;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_dd8.mDat = (proxy *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  (local_dd8.mDat)->refcount = 1;
  *(undefined ***)local_dd8.mDat = &PTR__token_base_00332fd8;
  *(undefined4 *)&(local_dd8.mDat)->data = 0x16;
  local_dd0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_dd0[1] = 1;
  *local_dd0 = &PTR__token_expr_00334520;
  local_dd0[2] = 0;
  local_dc8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_dc8[1] = 1;
  *local_dc8 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_dc8 + 2) = 0x17;
  local_dc0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_dc0[1] = 1;
  *local_dc0 = &PTR__token_expr_00334520;
  local_dc0[2] = 0;
  local_db8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_db8[1] = 0;
  *local_db8 = &PTR__token_base_00332bc0;
  local_358._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_358._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_358._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_358._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_358._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_358._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_358._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_358._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_358._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_358._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  paVar12 = &local_dd8;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)paVar12);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333e50;
  p_Var13 = &local_358;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_d60.mDat = (proxy *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  (local_d60.mDat)->refcount = 1;
  *(undefined ***)local_d60.mDat = &PTR__token_base_00332fd8;
  *(undefined4 *)&(local_d60.mDat)->data = 0x16;
  local_d58 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_d58[1] = 1;
  *local_d58 = &PTR__token_expr_00334520;
  local_d58[2] = 0;
  local_d50 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_d50[1] = 1;
  *local_d50 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_d50 + 2) = 0x17;
  local_d48 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_d48[1] = 1;
  *local_d48 = &PTR__token_expr_00334520;
  local_d48[2] = 0;
  local_d40 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_d40[1] = 1;
  *local_d40 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_d40 + 2) = 0xc;
  local_d38 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_d38[1] = 1;
  *local_d38 = &PTR__token_expr_00334520;
  local_d38[2] = 0;
  local_d30 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_d30[1] = 0;
  *local_d30 = &PTR__token_base_00332bc0;
  local_3a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_3a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_3a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_3a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_3a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_3a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_3a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_3a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_3a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_3a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  paVar12 = &local_d60;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)paVar12);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333eb0;
  p_Var13 = &local_3a8;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_ca0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_ca0[1] = 1;
  *local_ca0 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_ca0 + 2) = 0x18;
  local_c98 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_c98[1] = 0;
  *local_c98 = &PTR__token_base_00332bc0;
  local_3f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_3f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_3f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_3f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_3f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_3f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_3f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_3f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_3f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_3f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_ca0;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333f10;
  p_Var13 = &local_3f8;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_cb0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_cb0[1] = 1;
  *local_cb0 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_cb0 + 2) = 0x19;
  local_ca8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_ca8[1] = 0;
  *local_ca8 = &PTR__token_base_00332bc0;
  local_448._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_448._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_448._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_448._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_448._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_448._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_448._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_448._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_448._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_448._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_cb0;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333f70;
  p_Var13 = &local_448;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_ba8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_ba8[1] = 1;
  *local_ba8 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_ba8 + 2) = 0x1a;
  local_ba0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_ba0[1] = 1;
  *local_ba0 = &PTR__token_expr_00334520;
  local_ba0[2] = 0;
  local_b98 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_b98[1] = 0;
  *local_b98 = &PTR__token_base_00332bc0;
  local_498._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_498._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_498._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_498._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_498._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_498._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_498._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_498._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_498._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_498._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_ba8;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333fd0;
  p_Var13 = &local_498;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_878 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_878[1] = 1;
  *local_878 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_878 + 2) = 0x1a;
  local_870 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_870[1] = 1;
  *local_870 = &PTR__token_expr_00334520;
  local_870[2] = 0;
  local_868 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_868[1] = 1;
  *local_868 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_868 + 2) = 0x1b;
  local_860 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_860[1] = 0;
  *local_860 = &PTR__token_base_00332bc0;
  local_4e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_4e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_4e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_4e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_4e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_4e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_4e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_4e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_4e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_4e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_878;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00333fd0;
  p_Var13 = &local_4e8;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_bc0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_bc0[1] = 1;
  *local_bc0 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_bc0 + 2) = 0x1c;
  local_bb8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_bb8[1] = 1;
  *local_bb8 = &PTR__token_expr_00334520;
  local_bb8[2] = 0;
  local_bb0 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_bb0[1] = 0;
  *local_bb0 = &PTR__token_base_00332bc0;
  local_538._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_538._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_538._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_538._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_538._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_538._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_538._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_538._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_538._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_538._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_bc0;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00334030;
  p_Var13 = &local_538;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_cc0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_cc0[1] = 1;
  *local_cc0 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_cc0 + 2) = 0x1c;
  local_cb8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_cb8[1] = 0;
  *local_cb8 = &PTR__token_base_00332bc0;
  local_588._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_588._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_588._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_588._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_588._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_588._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_588._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_588._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_588._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_588._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_cc0;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00334090;
  p_Var13 = &local_588;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_bd8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_bd8[1] = 1;
  *local_bd8 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_bd8 + 2) = 5;
  local_bd0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_bd0[1] = 1;
  *local_bd0 = &PTR__token_expr_00334520;
  local_bd0[2] = 0;
  local_bc8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_bc8[1] = 0;
  *local_bc8 = &PTR__token_base_00332bc0;
  local_5d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_5d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_5d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_5d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_5d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_5d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_5d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_5d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_5d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_5d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_bd8;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_003340f0;
  p_Var13 = &local_5d8;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_c30 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_c30[1] = 1;
  *local_c30 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_c30 + 2) = 5;
  local_c28 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_c28[1] = 1;
  *local_c28 = &PTR__token_expr_00334520;
  local_c28[2] = 0;
  local_c20 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_c20[1] = 1;
  *local_c20 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_c20 + 2) = 6;
  local_c18 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_c18[1] = 1;
  *local_c18 = &PTR__token_expr_00334520;
  local_c18[2] = 0;
  local_c10 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_c10[1] = 0;
  *local_c10 = &PTR__token_base_00332bc0;
  local_628._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_628._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_628._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_628._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_628._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_628._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_628._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_628._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_628._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_628._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_c30;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_003340f0;
  p_Var13 = &local_628;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_cd0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_cd0[1] = 1;
  *local_cd0 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_cd0 + 2) = 0x1d;
  local_cc8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_cc8[1] = 0;
  *local_cc8 = &PTR__token_base_00332bc0;
  local_678._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_678._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_678._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_678._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_678._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_678._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_678._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_678._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_678._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_678._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_cd0;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00334150;
  p_Var13 = &local_678;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_bf0 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_bf0[1] = 1;
  *local_bf0 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_bf0 + 2) = 0x1e;
  local_be8 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_be8[1] = 1;
  *local_be8 = &PTR__token_expr_00334520;
  local_be8[2] = 0;
  local_be0 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_be0[1] = 0;
  *local_be0 = &PTR__token_base_00332bc0;
  local_6c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_6c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_6c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_6c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_6c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_6c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_6c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_6c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_6c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_6c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_bf0;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_003341b0;
  p_Var13 = &local_6c8;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)p_Var13,pmVar7);
  local_c08 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_c08[1] = 1;
  *local_c08 = &PTR__token_base_00332fd8;
  *(undefined4 *)(local_c08 + 2) = 0x1f;
  local_c00 = (undefined8 *)token_base::operator_new((token_base *)0x18,(size_t)p_Var13);
  local_c00[1] = 1;
  *local_c00 = &PTR__token_expr_00334520;
  local_c00[2] = 0;
  local_bf8 = (undefined8 *)token_base::operator_new((token_base *)0x10,(size_t)p_Var13);
  local_bf8[1] = 0;
  *local_bf8 = &PTR__token_base_00332bc0;
  local_718._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_718._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_718._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_718._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_718._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_718._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_718._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_718._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_718._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_718._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ppuVar10 = &local_c08;
  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
  _M_range_initialize<cs::token_base*const*>();
  pmVar7 = (method_base *)method_base::operator_new((method_base *)0x8,(size_t)ppuVar10);
  pmVar7->_vptr_method_base = (_func_int **)&PTR__method_base_00334210;
  translator_type::add_method
            (this_00,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_718,pmVar7
            );
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_718);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_6c8);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_678);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_628);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_5d8);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_588);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_538);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_4e8);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_498);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_448);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_3f8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_3a8);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_358);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_308);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_2b8);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_268);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_178);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_128);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_d8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_88);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_218);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_1c8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_a58);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_a08);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_9b8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_968);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_918);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_8c8);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_858);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_808);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_7b8);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_768);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_d28);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_eb8);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  lVar2 = *(long *)(*(long *)this + 0x10);
  local_eb8._0_8_ = (instance_type *)0x0;
  local_eb8._8_8_ = 0;
  pptStack_ea0 = (_Elt_pointer)
                 std::
                 _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:511:29)>
                 ::_M_invoke;
  local_ea8 = (_Elt_pointer)
              std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:511:29)>
              ::_M_manager;
  local_1c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&char::typeinfo;
  local_df0.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::char_ext;
  local_df0.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_00344880;
  if (DAT_00344880 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_00344880->_M_use_count = DAT_00344880->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_00344880->_M_use_count = DAT_00344880->_M_use_count + 1;
    }
  }
  pdVar8 = domain_manager::add_buildin_type<char_const(&)[5]>
                     ((domain_manager *)(lVar2 + 0x30),(char (*) [5])0x2c35b9,
                      (function<cs_impl::any_()> *)local_eb8,(type_index *)&local_1c8,&local_df0);
  local_d28._M_unused._M_object = (void *)0x0;
  local_d28._8_8_ = 0;
  pcStack_d10 = std::
                _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:513:31)>
                ::_M_invoke;
  local_d18 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:513:31)>
              ::_M_manager;
  local_218._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&numeric::typeinfo;
  local_e00.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::number_ext;
  local_e00.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_00344870;
  if (DAT_00344870 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_00344870->_M_use_count = DAT_00344870->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_00344870->_M_use_count = DAT_00344870->_M_use_count + 1;
    }
  }
  pdVar8 = domain_manager::add_buildin_type<char_const(&)[7]>
                     (pdVar8,(char (*) [7])0x2c0753,(function<cs_impl::any_()> *)&local_d28,
                      (type_index *)&local_218,&local_e00);
  local_768._M_unused._M_object = (void *)0x0;
  local_768._8_8_ = 0;
  pcStack_750 = std::
                _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:515:32)>
                ::_M_invoke;
  local_758 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:515:32)>
              ::_M_manager;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&numeric::typeinfo;
  pdVar8 = domain_manager::add_buildin_type<char_const(&)[8]>
                     (pdVar8,(char (*) [8])0x2d0fdc,(function<cs_impl::any_()> *)&local_768,
                      (type_index *)&local_88);
  local_7b8._M_unused._M_object = (void *)0x0;
  local_7b8._8_8_ = 0;
  pcStack_7a0 = std::
                _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:516:30)>
                ::_M_invoke;
  local_7a8 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:516:30)>
              ::_M_manager;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&numeric::typeinfo;
  pdVar8 = domain_manager::add_buildin_type<char_const(&)[6]>
                     (pdVar8,(char (*) [6])0x2c028c,(function<cs_impl::any_()> *)&local_7b8,
                      (type_index *)&local_d8);
  local_808._M_unused._M_object = (void *)0x0;
  local_808._8_8_ = 0;
  pcStack_7f0 = std::
                _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:517:32)>
                ::_M_invoke;
  local_7f8 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:517:32)>
              ::_M_manager;
  local_128._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&bool::typeinfo;
  pdVar8 = domain_manager::add_buildin_type<char_const(&)[8]>
                     (pdVar8,(char (*) [8])0x2c35ad,(function<cs_impl::any_()> *)&local_808,
                      (type_index *)&local_128);
  local_858._M_unused._M_object = (void *)0x0;
  local_858._8_8_ = 0;
  pcStack_840 = std::
                _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:518:32)>
                ::_M_invoke;
  local_848 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:518:32)>
              ::_M_manager;
  local_178._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&pointer::typeinfo;
  pdVar8 = domain_manager::add_buildin_type<char_const(&)[8]>
                     (pdVar8,(char (*) [8])0x2bf495,(function<cs_impl::any_()> *)&local_858,
                      (type_index *)&local_178);
  local_8c8._M_unused._M_object = (void *)0x0;
  local_8c8._8_8_ = 0;
  pcStack_8b0 = std::
                _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:519:31)>
                ::_M_invoke;
  local_8b8 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:519:31)>
              ::_M_manager;
  local_268._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&std::__cxx11::string::typeinfo;
  local_e10.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::string_ext;
  local_e10.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_00344930;
  if (DAT_00344930 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_00344930->_M_use_count = DAT_00344930->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_00344930->_M_use_count = DAT_00344930->_M_use_count + 1;
    }
  }
  pdVar8 = domain_manager::add_buildin_type<char_const(&)[7]>
                     (pdVar8,(char (*) [7])0x2bf589,(function<cs_impl::any_()> *)&local_8c8,
                      (type_index *)&local_268,&local_e10);
  local_918._M_unused._M_object = (void *)0x0;
  local_918._8_8_ = 0;
  pcStack_900 = std::
                _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:521:29)>
                ::_M_invoke;
  local_908 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:521:29)>
              ::_M_manager;
  local_2b8._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)&std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo;
  local_e20.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::list_ext;
  local_e20.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_003448b0;
  if (DAT_003448b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_003448b0->_M_use_count = DAT_003448b0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_003448b0->_M_use_count = DAT_003448b0->_M_use_count + 1;
    }
  }
  pdVar8 = domain_manager::add_buildin_type<char_const(&)[5]>
                     (pdVar8,(char (*) [5])0x2c3590,(function<cs_impl::any_()> *)&local_918,
                      (type_index *)&local_2b8,&local_e20);
  local_968._M_unused._M_object = (void *)0x0;
  local_968._8_8_ = 0;
  pcStack_950 = std::
                _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:522:30)>
                ::_M_invoke;
  local_958 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:522:30)>
              ::_M_manager;
  local_308._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)&std::deque<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo;
  local_e30.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::array_ext;
  local_e30.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_00344850;
  if (DAT_00344850 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_00344850->_M_use_count = DAT_00344850->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_00344850->_M_use_count = DAT_00344850->_M_use_count + 1;
    }
  }
  pdVar8 = domain_manager::add_buildin_type<char_const(&)[6]>
                     (pdVar8,(char (*) [6])0x2c41eb,(function<cs_impl::any_()> *)&local_968,
                      (type_index *)&local_308,&local_e30);
  local_9b8._M_unused._M_object = (void *)0x0;
  local_9b8._8_8_ = 0;
  pcStack_9a0 = std::
                _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:524:29)>
                ::_M_invoke;
  local_9a8 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:524:29)>
              ::_M_manager;
  local_358._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)&std::pair<cs_impl::any,cs_impl::any>::typeinfo;
  local_e40.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::pair_ext;
  local_e40.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_003448f0;
  if (DAT_003448f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_003448f0->_M_use_count = DAT_003448f0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_003448f0->_M_use_count = DAT_003448f0->_M_use_count + 1;
    }
  }
  pdVar8 = domain_manager::add_buildin_type<char_const(&)[5]>
                     (pdVar8,(char (*) [5])0x2d03fd,(function<cs_impl::any_()> *)&local_9b8,
                      (type_index *)&local_358,&local_e40);
  local_a08._M_unused._M_object = (void *)0x0;
  local_a08._8_8_ = 0;
  pcStack_9f0 = std::
                _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:526:33)>
                ::_M_invoke;
  local_9f8 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:526:33)>
              ::_M_manager;
  local_3a8._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       &phmap::
        flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>
        ::typeinfo;
  local_e50.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::hash_set_ext;
  local_e50.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_003448d0;
  if (DAT_003448d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_003448d0->_M_use_count = DAT_003448d0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_003448d0->_M_use_count = DAT_003448d0->_M_use_count + 1;
    }
  }
  pdVar8 = domain_manager::add_buildin_type<char_const(&)[9]>
                     (pdVar8,(char (*) [9])0x2c2848,(function<cs_impl::any_()> *)&local_a08,
                      (type_index *)&local_3a8,&local_e50);
  local_a58._M_unused._M_object = (void *)0x0;
  local_a58._8_8_ = 0;
  pcStack_a40 = std::
                _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:528:33)>
                ::_M_invoke;
  local_a48 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:528:33)>
              ::_M_manager;
  local_3f8._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       &phmap::
        flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
        ::typeinfo;
  local_e60.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       cs_impl::hash_map_ext;
  local_e60.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       DAT_003448e0;
  if (DAT_003448e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_003448e0->_M_use_count = DAT_003448e0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_003448e0->_M_use_count = DAT_003448e0->_M_use_count + 1;
    }
  }
  pdVar8 = domain_manager::add_buildin_type<char_const(&)[9]>
                     (pdVar8,(char (*) [9])0x2c356e,(function<cs_impl::any_()> *)&local_a58,
                      (type_index *)&local_3f8,&local_e60);
  cs_impl::any::make_constant<std::shared_ptr<cs::context_type>,std::shared_ptr<cs::context_type>&>
            ((any *)&local_448,(shared_ptr<cs::context_type> *)this);
  pdVar8 = domain_manager::add_buildin_var<char_const(&)[8]>
                     (pdVar8,(char (*) [8])0x2d3da4,(var *)&local_448);
  local_c30 = (undefined8 *)CONCAT44(local_c30._4_4_,1);
  cs_impl::any::
  make_protect<cs::callable,cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),cs::callable::types>
            ((any *)&local_498,range,(types *)&local_c30);
  pdVar8 = domain_manager::add_buildin_var<char_const(&)[6]>
                     (pdVar8,(char (*) [6])0x2d372d,(var *)&local_498);
  make_cni<cs::numeric(&)(cs_impl::any_const&)>((cs *)&local_4e8,to_integer,true);
  pdVar8 = domain_manager::add_buildin_var<char_const(&)[11]>
                     (pdVar8,(char (*) [11])"to_integer",(var *)&local_4e8);
  make_cni<std::__cxx11::string(&)(cs_impl::any_const&)>((cs *)&local_538,to_string_abi_cxx11_,true)
  ;
  pdVar8 = domain_manager::add_buildin_var<char_const(&)[10]>
                     (pdVar8,(char (*) [10])"to_string",(var *)&local_538);
  make_cni<std::__cxx11::string(&)(cs_impl::any_const&)>((cs *)&local_588,type_abi_cxx11_,true);
  pdVar8 = domain_manager::add_buildin_var<char_const(&)[5]>
                     (pdVar8,(char (*) [5])0x2bf551,(var *)&local_588);
  make_cni<cs_impl::any(&)(cs_impl::any_const&)>((cs *)&local_5d8,clone,false);
  pdVar8 = domain_manager::add_buildin_var<char_const(&)[6]>
                     (pdVar8,(char (*) [6])"clone",(var *)&local_5d8);
  make_cni<cs_impl::any(&)(cs_impl::any_const&)>((cs *)&local_628,move,false);
  pdVar8 = domain_manager::add_buildin_var<char_const(&)[5]>
                     (pdVar8,(char (*) [5])0x2c0454,(var *)&local_628);
  make_cni<void(&)(cs_impl::any&,cs_impl::any&)>((cs *)&local_678,swap,true);
  pdVar8 = domain_manager::add_buildin_var<char_const(&)[5]>
                     (pdVar8,(char (*) [5])"swap",(var *)&local_678);
  make_cni<bool(&)(cs::type_id_const&,cs::type_id_const&)>((cs *)&local_6c8,is_a,true);
  pdVar8 = domain_manager::add_buildin_var<char_const(&)[5]>
                     (pdVar8,(char (*) [5])"is_a",(var *)&local_6c8);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            ((any *)&local_718,(shared_ptr<cs::name_space> *)&cs_impl::except_ext);
  pdVar8 = domain_manager::add_buildin_var<char_const(&)[10]>
                     (pdVar8,(char (*) [10])0x2c4186,(var *)&local_718);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_d60,(shared_ptr<cs::name_space> *)&cs_impl::iostream_ext);
  pdVar8 = domain_manager::add_buildin_var<char_const(&)[9]>
                     (pdVar8,(char (*) [9])"iostream",&local_d60);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_d88,(shared_ptr<cs::name_space> *)&cs_impl::system_ext);
  pdVar8 = domain_manager::add_buildin_var<char_const(&)[7]>
                     (pdVar8,(char (*) [7])"system",&local_d88);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_db0,(shared_ptr<cs::name_space> *)&cs_impl::runtime_ext);
  pdVar8 = domain_manager::add_buildin_var<char_const(&)[8]>
                     (pdVar8,(char (*) [8])"runtime",&local_db0);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_dd8,(shared_ptr<cs::name_space> *)&cs_impl::math_ext);
  domain_manager::add_buildin_var<char_const(&)[5]>(pdVar8,(char (*) [5])"math",&local_dd8);
  cs_impl::any::recycle(&local_dd8);
  cs_impl::any::recycle(&local_db0);
  cs_impl::any::recycle(&local_d88);
  cs_impl::any::recycle(&local_d60);
  cs_impl::any::recycle((any *)&local_718);
  cs_impl::any::recycle((any *)&local_6c8);
  cs_impl::any::recycle((any *)&local_678);
  cs_impl::any::recycle((any *)&local_628);
  cs_impl::any::recycle((any *)&local_5d8);
  cs_impl::any::recycle((any *)&local_588);
  cs_impl::any::recycle((any *)&local_538);
  cs_impl::any::recycle((any *)&local_4e8);
  cs_impl::any::recycle((any *)&local_498);
  cs_impl::any::recycle((any *)&local_448);
  _Var9._M_pi = extraout_RDX;
  if (local_e60.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e60.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_00;
  }
  if (local_a48 != (code *)0x0) {
    (*local_a48)(&local_a58,&local_a58,3);
    _Var9._M_pi = extraout_RDX_01;
  }
  if (local_e50.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e50.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_02;
  }
  if (local_9f8 != (code *)0x0) {
    (*local_9f8)(&local_a08,&local_a08,3);
    _Var9._M_pi = extraout_RDX_03;
  }
  if (local_e40.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e40.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_04;
  }
  if (local_9a8 != (code *)0x0) {
    (*local_9a8)(&local_9b8,&local_9b8,3);
    _Var9._M_pi = extraout_RDX_05;
  }
  if (local_e30.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e30.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_06;
  }
  if (local_958 != (code *)0x0) {
    (*local_958)(&local_968,&local_968,3);
    _Var9._M_pi = extraout_RDX_07;
  }
  if (local_e20.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e20.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_08;
  }
  if (local_908 != (code *)0x0) {
    (*local_908)(&local_918,&local_918,3);
    _Var9._M_pi = extraout_RDX_09;
  }
  if (local_e10.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e10.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_10;
  }
  if (local_8b8 != (code *)0x0) {
    (*local_8b8)(&local_8c8,&local_8c8,3);
    _Var9._M_pi = extraout_RDX_11;
  }
  if (local_848 != (code *)0x0) {
    (*local_848)(&local_858,&local_858,3);
    _Var9._M_pi = extraout_RDX_12;
  }
  if (local_7f8 != (code *)0x0) {
    (*local_7f8)(&local_808,&local_808,3);
    _Var9._M_pi = extraout_RDX_13;
  }
  if (local_7a8 != (code *)0x0) {
    (*local_7a8)(&local_7b8,&local_7b8,3);
    _Var9._M_pi = extraout_RDX_14;
  }
  if (local_758 != (code *)0x0) {
    (*local_758)(&local_768,&local_768,3);
    _Var9._M_pi = extraout_RDX_15;
  }
  if (local_e00.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e00.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_16;
  }
  if (local_d18 != (code *)0x0) {
    (*local_d18)(&local_d28,&local_d28,3);
    _Var9._M_pi = extraout_RDX_17;
  }
  if (local_df0.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_df0.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_18;
  }
  if (local_ea8 != (_Elt_pointer)0x0) {
    (*(code *)local_ea8)(local_eb8,local_eb8,3);
    _Var9._M_pi = extraout_RDX_19;
  }
  cVar14.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  cVar14.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (context_t)cVar14.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

context_t create_context(const array &args)
	{
		cs_impl::init_extensions();
		context_t context = std::make_shared<context_type>();
		context->compiler = std::make_shared<compiler_type>(context);
		context->instance = std::make_shared<instance_type>(context, current_process->stack_size);
		context->cmd_args = cs::var::make_constant<cs::array>(args);
		// Init Grammars
		(*context->compiler)
		// Expression Grammar
		.add_method({new token_expr(tree_type<token_base *>()), new token_endline(0)},
		new method_expression)
		// Import Grammar
		.add_method({new token_action(action_types::import_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_import)
		.add_method({new token_action(action_types::import_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::as_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_import_as)
		// Package Grammar
		.add_method({new token_action(action_types::package_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_package)
		// Involve Grammar
		.add_method({new token_action(action_types::using_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_involve)
		// Var Grammar
		.add_method({new token_action(action_types::var_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_var)
		.add_method({new token_action(action_types::link_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_link)
		.add_method({new token_action(action_types::constant_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)},
		new method_constant)
		// End Grammar
		.add_method({new token_action(action_types::endblock_), new token_endline(0)}, new method_end)
		// Block Grammar
		.add_method({new token_action(action_types::block_), new token_endline(0)}, new method_block)
		// Namespace Grammar
		.add_method({new token_action(action_types::namespace_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_namespace)
		// If Grammar
		.add_method({new token_action(action_types::if_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_if)
		// Else Grammar
		.add_method({new token_action(action_types::else_), new token_endline(0)}, new method_else)
		// Switch Grammar
		.add_method({new token_action(action_types::switch_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_switch)
		// Case Grammar
		.add_method({new token_action(action_types::case_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_case)
		// Default Grammar
		.add_method({new token_action(action_types::default_), new token_endline(0)},
		new method_default)
		// While Grammar
		.add_method({new token_action(action_types::while_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_while)
		// Until Grammar
		.add_method({new token_action(action_types::until_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_until)
		// Loop Grammar
		.add_method({new token_action(action_types::loop_), new token_endline(0)}, new method_loop)
		// For Grammar
		.add_method({new token_action(action_types::for_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_for)
		.add_method({new token_action(action_types::for_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::do_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_for_do)
		.add_method({new token_action(action_types::foreach_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::in_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_foreach)
		.add_method({new token_action(action_types::foreach_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::in_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::do_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_foreach_do)
		// Break Grammar
		.add_method({new token_action(action_types::break_), new token_endline(0)}, new method_break)
		// Continue Grammar
		.add_method({new token_action(action_types::continue_), new token_endline(0)},
		new method_continue)
		// Function Grammar
		.add_method({new token_action(action_types::function_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_function)
		.add_method({new token_action(action_types::function_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::override_), new token_endline(0)},
		new method_function)
		// Return Grammar
		.add_method({new token_action(action_types::return_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_return)
		.add_method({new token_action(action_types::return_), new token_endline(0)},
		new method_return_no_value)
		// Struct Grammar
		.add_method({new token_action(action_types::struct_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_struct)
		.add_method({new token_action(action_types::struct_), new token_expr(tree_type<token_base *>()),
			            new token_action(action_types::extends_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_struct)
		// Try Grammar
		.add_method({new token_action(action_types::try_), new token_endline(0)}, new method_try)
		// Catch Grammar
		.add_method({new token_action(action_types::catch_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_catch)
		// Throw Grammar
		.add_method({new token_action(action_types::throw_), new token_expr(tree_type<token_base *>()),
			            new token_endline(0)}, new method_throw);
		// Init Runtime
		context->instance->storage
		// Internal Types
		.add_buildin_type("char", []() -> var { return var::make<char>('\0'); }, typeid(char),
		                  cs_impl::char_ext)
		.add_buildin_type("number", []() -> var { return var::make<numeric>(0); }, typeid(numeric),
		                  cs_impl::number_ext)
		.add_buildin_type("integer", []() -> var { return var::make<numeric>(0); }, typeid(numeric))
		.add_buildin_type("float", []() -> var { return var::make<numeric>(0.0); }, typeid(numeric))
		.add_buildin_type("boolean", []() -> var { return var::make<boolean>(true); }, typeid(boolean))
		.add_buildin_type("pointer", []() -> var { return var::make<pointer>(null_pointer); }, typeid(pointer))
		.add_buildin_type("string", []() -> var { return var::make<string>(); }, typeid(string),
		                  cs_impl::string_ext)
		.add_buildin_type("list", []() -> var { return var::make<list>(); }, typeid(list), cs_impl::list_ext)
		.add_buildin_type("array", []() -> var { return var::make<array>(); }, typeid(array),
		                  cs_impl::array_ext)
		.add_buildin_type("pair", []() -> var { return var::make<pair>(numeric(0), numeric(0)); }, typeid(pair),
		                  cs_impl::pair_ext)
		.add_buildin_type("hash_set", []() -> var { return var::make<hash_set>(); }, typeid(hash_set),
		                  cs_impl::hash_set_ext)
		.add_buildin_type("hash_map", []() -> var { return var::make<hash_map>(); }, typeid(hash_map),
		                  cs_impl::hash_map_ext)
		// Context
		.add_buildin_var("context", var::make_constant<context_t>(context))
		// Add Internal Functions to storage
		.add_buildin_var("range", var::make_protect<callable>(range, callable::types::request_fold))
		.add_buildin_var("to_integer", make_cni(to_integer, true))
		.add_buildin_var("to_string", make_cni(to_string, true))
		.add_buildin_var("type", make_cni(type, true))
		.add_buildin_var("clone", make_cni(clone))
		.add_buildin_var("move", make_cni(move))
		.add_buildin_var("swap", make_cni(swap, true))
		.add_buildin_var("is_a", make_cni(is_a, true))
		// Add extensions to storage
		.add_buildin_var("exception", make_namespace(cs_impl::except_ext))
		.add_buildin_var("iostream", make_namespace(cs_impl::iostream_ext))
		.add_buildin_var("system", make_namespace(cs_impl::system_ext))
		.add_buildin_var("runtime", make_namespace(cs_impl::runtime_ext))
		.add_buildin_var("math", make_namespace(cs_impl::math_ext));
		return context;
	}